

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O3

void __thiscall
DISABLED_RecoveryTest_MemoryTest_Test::TestBody(DISABLED_RecoveryTest_MemoryTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  char cVar4;
  DeathTest *pDVar5;
  DeathTest *gtest_dt;
  DeathTest *local_e8;
  DeathTest *local_e0;
  AssertHelper local_d8 [4];
  RE local_b8;
  
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::RE::Init(&local_b8,"::NewHandler");
    bVar2 = testing::internal::DeathTest::Create
                      ("MemoryOverflow()",&local_b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
                       ,0x69,&local_e8);
    pDVar5 = local_e8;
    if (bVar2) {
      if (local_e8 == (DeathTest *)0x0) {
LAB_0010d7fb:
        testing::internal::RE::~RE(&local_b8);
        return;
      }
      local_e0 = local_e8;
      iVar3 = (*local_e8->_vptr_DeathTest[2])(local_e8);
      pDVar1 = local_e8;
      if (iVar3 == 0) {
        testing::ExitedWithCode::ExitedWithCode((ExitedWithCode *)local_d8,3);
        iVar3 = (*local_e8->_vptr_DeathTest[3])();
        bVar2 = testing::ExitedWithCode::operator()((ExitedWithCode *)local_d8,iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        cVar4 = (char)iVar3;
      }
      else {
        cVar4 = '\x01';
        if (iVar3 == 1) {
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            MemoryOverflow();
          }
          (*local_e8->_vptr_DeathTest[5])(local_e8,2);
          (*pDVar1->_vptr_DeathTest[5])(pDVar1,0);
          pDVar5 = local_e0;
          if (local_e0 == (DeathTest *)0x0) goto LAB_0010d7fb;
        }
      }
      bVar2 = testing::internal::IsTrue(true);
      if (bVar2) {
        (*pDVar5->_vptr_DeathTest[1])(pDVar5);
      }
      if (cVar4 != '\0') goto LAB_0010d7fb;
    }
    testing::internal::RE::~RE(&local_b8);
  }
  testing::Message::Message((Message *)&local_b8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (local_d8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
             ,0x69,message);
  testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_b8);
  testing::internal::AssertHelper::~AssertHelper(local_d8);
  if ((((long *)local_b8.pattern_ != (long *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)local_b8.pattern_ != (long *)0x0)) {
    (**(code **)(*(long *)local_b8.pattern_ + 8))();
  }
  return;
}

Assistant:

TEST_F (DISABLED_RecoveryTest, MemoryTest) {
    ASSERT_EXIT(MemoryOverflow(), ::testing::ExitedWithCode(CHILLOUT_EXIT_CODE), "::NewHandler");
}